

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::MessageOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar3;
  int line;
  Arena *arena;
  MessageOptions *_this;
  MessageOptions *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (MessageOptions *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::MessageOptions_const*,google::protobuf::MessageOptions*>
                          ((MessageOptions **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x23da;
LAB_00c2fe5c:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&(local_30->field_0)._impl_.uninterpreted_option_,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)(from_msg + 3));
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 0x3f) != 0) {
    if ((uVar2 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[4]._internal_metadata_.ptr_;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.features_ != nullptr";
        line = 0x23e3;
        goto LAB_00c2fe5c;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x38);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar3 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x38) = pvVar3;
      }
      else {
        FeatureSet::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar2 & 2) != 0) {
      *(undefined1 *)((long)&local_30->field_0 + 0x40) =
           *(undefined1 *)&from_msg[5]._vptr_MessageLite;
    }
    if ((uVar2 & 4) != 0) {
      (local_30->field_0)._impl_.no_standard_descriptor_accessor_ =
           *(bool *)((long)&from_msg[5]._vptr_MessageLite + 1);
    }
    if ((uVar2 & 8) != 0) {
      (local_30->field_0)._impl_.deprecated_ = *(bool *)((long)&from_msg[5]._vptr_MessageLite + 2);
    }
    if ((uVar2 & 0x10) != 0) {
      (local_30->field_0)._impl_.map_entry_ = *(bool *)((long)&from_msg[5]._vptr_MessageLite + 3);
    }
    if ((uVar2 & 0x20) != 0) {
      (local_30->field_0)._impl_.deprecated_legacy_json_field_conflicts_ =
           *(bool *)((long)&from_msg[5]._vptr_MessageLite + 4);
    }
  }
  pHVar1 = &(local_30->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  internal::ExtensionSet::MergeFrom
            (&(local_30->field_0)._impl_._extensions_,
             (MessageLite *)_MessageOptions_default_instance_,(ExtensionSet *)(from_msg + 1));
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void MessageOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<MessageOptions*>(&to_msg);
  auto& from = static_cast<const MessageOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.MessageOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.message_set_wire_format_ = from._impl_.message_set_wire_format_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.no_standard_descriptor_accessor_ = from._impl_.no_standard_descriptor_accessor_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.map_entry_ = from._impl_.map_entry_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.deprecated_legacy_json_field_conflicts_ = from._impl_.deprecated_legacy_json_field_conflicts_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}